

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall
caffe::InnerProductParameter::InternalSwap(InnerProductParameter *this,InnerProductParameter *other)

{
  bool bVar1;
  uint32 uVar2;
  int32 iVar3;
  int iVar4;
  FillerParameter *pFVar5;
  void *pvVar6;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar7;
  void *pvVar8;
  UnknownFieldSet *pUVar9;
  UnknownFieldSet *pUVar10;
  
  pFVar5 = this->weight_filler_;
  this->weight_filler_ = other->weight_filler_;
  other->weight_filler_ = pFVar5;
  pFVar5 = this->bias_filler_;
  this->bias_filler_ = other->bias_filler_;
  other->bias_filler_ = pFVar5;
  uVar2 = this->num_output_;
  this->num_output_ = other->num_output_;
  other->num_output_ = uVar2;
  bVar1 = this->transpose_;
  this->transpose_ = other->transpose_;
  other->transpose_ = bVar1;
  bVar1 = this->bias_term_;
  this->bias_term_ = other->bias_term_;
  other->bias_term_ = bVar1;
  iVar3 = this->axis_;
  this->axis_ = other->axis_;
  other->axis_ = iVar3;
  uVar2 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar2;
  pvVar8 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  pvVar6 = (other->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar8 & 1) == 0) {
    if (((ulong)pvVar6 & 1) == 0) goto LAB_00411cfa;
LAB_00411ce2:
    pUVar10 = (UnknownFieldSet *)((ulong)pvVar6 & 0xfffffffffffffffe);
  }
  else {
    if (((ulong)pvVar6 & 1) != 0) goto LAB_00411ce2;
    pUVar10 = google::protobuf::internal::
              InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              ::mutable_unknown_fields_slow
                        (&(other->_internal_metadata_).
                          super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        );
    pvVar8 = (this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_;
  }
  if (((ulong)pvVar8 & 1) == 0) {
    pUVar9 = google::protobuf::internal::
             InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ::mutable_unknown_fields_slow
                       (&(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       );
  }
  else {
    pUVar9 = (UnknownFieldSet *)((ulong)pvVar8 & 0xfffffffffffffffe);
  }
  pvVar7 = pUVar9->fields_;
  pUVar9->fields_ = pUVar10->fields_;
  pUVar10->fields_ = pvVar7;
LAB_00411cfa:
  iVar4 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar4;
  return;
}

Assistant:

void InnerProductParameter::InternalSwap(InnerProductParameter* other) {
  std::swap(weight_filler_, other->weight_filler_);
  std::swap(bias_filler_, other->bias_filler_);
  std::swap(num_output_, other->num_output_);
  std::swap(transpose_, other->transpose_);
  std::swap(bias_term_, other->bias_term_);
  std::swap(axis_, other->axis_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}